

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * matchimm(disctx *ctx,bitfield *bf,int spos)

{
  int iVar1;
  int in_EDX;
  long in_RDI;
  matches *res;
  undefined4 in_stack_00000008;
  int in_stack_00000094;
  expr *in_stack_fffffffffffffff8;
  matches *__ptr;
  
  if (in_EDX == *(int *)(*(long *)(in_RDI + 0x50) + 0x18)) {
    __ptr = (matches *)0x0;
  }
  else {
    __ptr = alwaysmatches(in_stack_00000094);
    iVar1 = setbfe((match *)CONCAT44(spos,in_stack_00000008),(bitfield *)res,
                   in_stack_fffffffffffffff8);
    if (iVar1 == 0) {
      free(__ptr->m);
      free(__ptr);
      __ptr = (matches *)0x0;
    }
  }
  return __ptr;
}

Assistant:

struct matches *matchimm (struct disctx *ctx, const struct bitfield *bf, int spos) {
	if (spos == ctx->line->atomsnum)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	if (setbfe(res->m, bf, ctx->line->atoms[spos]))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}